

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_SharingSize(DdNode **nodeArray,int n)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (n < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    do {
      iVar1 = ddDagInt((DdNode *)((ulong)nodeArray[uVar3] & 0xfffffffffffffffe));
      iVar2 = iVar2 + iVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  if (0 < n) {
    uVar3 = 0;
    do {
      ddClearFlag((DdNode *)((ulong)nodeArray[uVar3] & 0xfffffffffffffffe));
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return iVar2;
}

Assistant:

int
Cudd_SharingSize(
  DdNode ** nodeArray,
  int  n)
{
    int i,j;

    i = 0;
    for (j = 0; j < n; j++) {
        i += ddDagInt(Cudd_Regular(nodeArray[j]));
    }
    for (j = 0; j < n; j++) {
        ddClearFlag(Cudd_Regular(nodeArray[j]));
    }
    return(i);

}